

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGhsMultiGenerator::AddAllTarget(cmGlobalGhsMultiGenerator *this)

{
  __single_object this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  TargetType TVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_01;
  reference ppVar5;
  pointer pcVar6;
  const_reference ppcVar7;
  undefined4 extraout_var;
  cmLocalGenerator *pcVar8;
  reference ppcVar9;
  GeneratorTargetVector *this_02;
  reference this_03;
  pointer pcVar10;
  string *name;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *tgt;
  const_iterator __end4;
  const_iterator __begin4;
  GeneratorTargetVector *__range4;
  cmLocalGenerator *i;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range3;
  allocator<char> local_b1;
  string local_b0;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_90;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_88;
  allocator<char> local_79;
  string local_78;
  cmLocalGenerator *local_58;
  cmTarget *allBuild;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_40;
  __single_object cc;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *gen;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  cmGlobalGhsMultiGenerator *this_local;
  
  this_01 = &(this->super_cmGlobalGenerator).ProjectMap;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
           ::begin(this_01);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
          ::end(this_01);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&it), bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator*(&__end1);
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         &ppVar5->second;
    bVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                      ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                       cc._M_t.
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
    if (!bVar1) {
      std::make_unique<cmCustomCommand>();
      pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                         (&local_40);
      cmCustomCommand::SetEscapeOldStyle(pcVar6,false);
      pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                         (&local_40);
      cmCustomCommand::SetComment(pcVar6,"Build all projects");
      ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           cc._M_t.
                           super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                           .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,0);
      pcVar8 = *ppcVar7;
      iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1b])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,(char *)CONCAT44(extraout_var,iVar2),&local_79);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                (&local_88,&local_40);
      pcVar8 = (cmLocalGenerator *)
               cmLocalGenerator::AddUtilityCommand(pcVar8,&local_78,true,&local_88);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_88);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      local_58 = pcVar8;
      ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           cc._M_t.
                           super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                           .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,0);
      pcVar8 = *ppcVar7;
      std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                 cc._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,0);
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*const&>
                ((cmTarget **)&local_90,&local_58);
      cmLocalGenerator::AddGeneratorTarget(pcVar8,&local_90);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_90);
      uVar3 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x2e])();
      pcVar8 = local_58;
      if ((uVar3 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"FOLDER",&local_b1);
        cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
                  ((string *)&__range3,&this->super_cmGlobalGenerator);
        cmTarget::SetProperty((cmTarget *)pcVar8,&local_b0,(string *)&__range3);
        std::__cxx11::string::~string((string *)&__range3);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      this_00._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      __end3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                         ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                          cc._M_t.
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
      i = (cmLocalGenerator *)
          std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                    ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                     this_00._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                         *)&i), bVar1) {
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&__end3);
        this_02 = cmLocalGenerator::GetGeneratorTargets(*ppcVar9);
        __end4 = std::
                 vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ::begin(this_02);
        tgt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
              std::
              vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              ::end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                           *)&tgt), bVar1) {
          this_03 = __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                    ::operator*(&__end4);
          pcVar10 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                    operator->(this_03);
          TVar4 = cmGeneratorTarget::GetType(pcVar10);
          if (TVar4 != GLOBAL_TARGET) {
            pcVar10 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                      operator->(this_03);
            bVar1 = cmGeneratorTarget::IsImported(pcVar10);
            if (!bVar1) {
              ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::
                        operator[]((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    *)cc._M_t.
                                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                                   0);
              pcVar8 = *ppcVar7;
              pcVar10 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ::get(this_03);
              bVar1 = cmGlobalGenerator::IsExcluded(&this->super_cmGlobalGenerator,pcVar8,pcVar10);
              pcVar8 = local_58;
              if (!bVar1) {
                pcVar10 = std::
                          unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                          operator->(this_03);
                name = cmGeneratorTarget::GetName_abi_cxx11_(pcVar10);
                cmTarget::AddUtility((cmTarget *)pcVar8,name,false,(cmMakefile *)0x0);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
          ::operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end3);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_40);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::AddAllTarget()
{
  // Add a special target that depends on ALL projects for easy build
  // of one configuration only.
  for (auto const& it : this->ProjectMap) {
    std::vector<cmLocalGenerator*> const& gen = it.second;
    // add the ALL_BUILD to the first local generator of each project
    if (!gen.empty()) {
      // Use no actual command lines so that the target itself is not
      // considered always out of date.
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetEscapeOldStyle(false);
      cc->SetComment("Build all projects");
      cmTarget* allBuild = gen[0]->AddUtilityCommand(this->GetAllTargetName(),
                                                     true, std::move(cc));

      gen[0]->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(allBuild, gen[0]));

      // Organize in the "predefined targets" folder:
      if (this->UseFolderProperty()) {
        allBuild->SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
      }

      // Now make all targets depend on the ALL_BUILD target
      for (cmLocalGenerator const* i : gen) {
        for (const auto& tgt : i->GetGeneratorTargets()) {
          // Skip global or imported targets
          if (tgt->GetType() == cmStateEnums::GLOBAL_TARGET ||
              tgt->IsImported()) {
            continue;
          }
          // Skip Exclude From All Targets
          if (!this->IsExcluded(gen[0], tgt.get())) {
            allBuild->AddUtility(tgt->GetName(), false);
          }
        }
      }
    }
  }
}